

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_atomic_func_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,char *op)

{
  uint32_t result_id_00;
  uint32_t result_type_00;
  uint32_t id;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar1;
  undefined1 local_c8 [48];
  undefined1 local_98 [32];
  undefined1 local_78 [64];
  _Node_iterator_base<unsigned_int,_false> local_38;
  char local_30;
  uint32_t local_24;
  uint32_t local_20;
  uint32_t op2_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  local_24 = op2;
  local_20 = op1;
  op2_local = op0;
  op1_local = result_id;
  op0_local = result_type;
  _result_id_local = this;
  pVar1 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert(&(this->super_Compiler).forced_temporaries,&op1_local);
  result_type_00 = op0_local;
  result_id_00 = op1_local;
  local_38._M_cur = (__node_type *)pVar1.first.super__Node_iterator_base<unsigned_int,_false>._M_cur
  ;
  local_30 = pVar1.second;
  id = (uint32_t)this;
  to_non_uniform_aware_expression_abi_cxx11_((CompilerGLSL *)local_78,id);
  to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_98,id,SUB41(local_20,0));
  to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_c8,id,SUB41(local_24,0));
  join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
            ((spirv_cross *)(local_78 + 0x20),&op,(char (*) [2])0x5cba12,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
             (char (*) [3])0x5cb8ef,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
             (char (*) [3])0x5cb8ef,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
             (char (*) [2])0x5b48c4);
  emit_op(this,result_type_00,result_id_00,(string *)(local_78 + 0x20),false,false);
  ::std::__cxx11::string::~string((string *)(local_78 + 0x20));
  ::std::__cxx11::string::~string((string *)local_c8);
  ::std::__cxx11::string::~string((string *)local_98);
  ::std::__cxx11::string::~string((string *)local_78);
  Compiler::flush_all_atomic_capable_variables(&this->super_Compiler);
  return;
}

Assistant:

void CompilerGLSL::emit_atomic_func_op(uint32_t result_type, uint32_t result_id,
                                       uint32_t op0, uint32_t op1, uint32_t op2,
                                       const char *op)
{
	forced_temporaries.insert(result_id);
	emit_op(result_type, result_id,
	        join(op, "(", to_non_uniform_aware_expression(op0), ", ",
	             to_unpacked_expression(op1), ", ", to_unpacked_expression(op2), ")"), false);
	flush_all_atomic_capable_variables();
}